

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

CNodeState * __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::State(PeerManagerImpl *this,NodeId pnode)

{
  _Base_ptr p_Var1;
  CNodeState *pCVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  long in_FS_OFFSET;
  
  p_Var4 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var4->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(long *)(p_Var3 + 1) < pnode]) {
    if (pnode <= *(long *)(p_Var3 + 1)) {
      p_Var1 = p_Var3;
    }
  }
  p_Var3 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var4) && (p_Var3 = p_Var1, pnode < *(long *)(p_Var1 + 1))) {
    p_Var3 = &p_Var4->_M_header;
  }
  pCVar2 = (CNodeState *)0x0;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    pCVar2 = (CNodeState *)&p_Var3[1]._M_parent;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pCVar2;
  }
  __stack_chk_fail();
}

Assistant:

CNodeState* PeerManagerImpl::State(NodeId pnode)
{
    return const_cast<CNodeState*>(std::as_const(*this).State(pnode));
}